

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O2

void __thiscall
PSVIWriterHandlers::processSchemaComponents(PSVIWriterHandlers *this,XSNamespaceItem *namespaceItem)

{
  XSNamedMap<xercesc_4_0::XSTypeDefinition> *this_00;
  XSTypeDefinition *type;
  XSNamedMap<xercesc_4_0::XSAttributeDeclaration> *this_01;
  XSAttributeDeclaration *attribute;
  XSNamedMap<xercesc_4_0::XSElementDeclaration> *this_02;
  XSElementDeclaration *element;
  XSNamedMap<xercesc_4_0::XSAttributeGroupDefinition> *this_03;
  XSAttributeGroupDefinition *attributeGroup;
  XSNamedMap<xercesc_4_0::XSModelGroupDefinition> *this_04;
  XSModelGroupDefinition *modelGroup;
  XSNamedMap<xercesc_4_0::XSNotationDeclaration> *this_05;
  XSNotationDeclaration *notation;
  COMPONENT_TYPE CVar1;
  XMLSize_t typeCount;
  ulong uVar2;
  XMLSize_t notationCount;
  
  sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSchemaComponents);
  CVar1 = (COMPONENT_TYPE)namespaceItem;
  this_00 = (XSNamedMap<xercesc_4_0::XSTypeDefinition> *)
            xercesc_4_0::XSNamespaceItem::getComponents(CVar1);
  for (uVar2 = 0; uVar2 < *(ulong *)(*(long *)(this_00 + 0x10) + 0x10); uVar2 = uVar2 + 1) {
    type = xercesc_4_0::XSNamedMap<xercesc_4_0::XSTypeDefinition>::item(this_00,uVar2);
    processTypeDefinition(this,type);
  }
  this_01 = (XSNamedMap<xercesc_4_0::XSAttributeDeclaration> *)
            xercesc_4_0::XSNamespaceItem::getComponents(CVar1);
  for (uVar2 = 0; uVar2 < *(ulong *)(*(long *)(this_01 + 0x10) + 0x10); uVar2 = uVar2 + 1) {
    attribute = xercesc_4_0::XSNamedMap<xercesc_4_0::XSAttributeDeclaration>::item(this_01,uVar2);
    processAttributeDeclaration(this,attribute);
  }
  this_02 = (XSNamedMap<xercesc_4_0::XSElementDeclaration> *)
            xercesc_4_0::XSNamespaceItem::getComponents(CVar1);
  for (uVar2 = 0; uVar2 < *(ulong *)(*(long *)(this_02 + 0x10) + 0x10); uVar2 = uVar2 + 1) {
    element = xercesc_4_0::XSNamedMap<xercesc_4_0::XSElementDeclaration>::item(this_02,uVar2);
    processElementDeclaration(this,element);
  }
  this_03 = (XSNamedMap<xercesc_4_0::XSAttributeGroupDefinition> *)
            xercesc_4_0::XSNamespaceItem::getComponents(CVar1);
  for (uVar2 = 0; uVar2 < *(ulong *)(*(long *)(this_03 + 0x10) + 0x10); uVar2 = uVar2 + 1) {
    attributeGroup =
         xercesc_4_0::XSNamedMap<xercesc_4_0::XSAttributeGroupDefinition>::item(this_03,uVar2);
    processAttributeGroupDefinition(this,attributeGroup);
  }
  this_04 = (XSNamedMap<xercesc_4_0::XSModelGroupDefinition> *)
            xercesc_4_0::XSNamespaceItem::getComponents(CVar1);
  for (uVar2 = 0; uVar2 < *(ulong *)(*(long *)(this_04 + 0x10) + 0x10); uVar2 = uVar2 + 1) {
    modelGroup = xercesc_4_0::XSNamedMap<xercesc_4_0::XSModelGroupDefinition>::item(this_04,uVar2);
    processModelGroupDefinition(this,modelGroup);
  }
  this_05 = (XSNamedMap<xercesc_4_0::XSNotationDeclaration> *)
            xercesc_4_0::XSNamespaceItem::getComponents(CVar1);
  for (uVar2 = 0; uVar2 < *(ulong *)(*(long *)(this_05 + 0x10) + 0x10); uVar2 = uVar2 + 1) {
    notation = xercesc_4_0::XSNamedMap<xercesc_4_0::XSNotationDeclaration>::item(this_05,uVar2);
    processNotationDeclaration(this,notation);
  }
  sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSchemaComponents);
  return;
}

Assistant:

void PSVIWriterHandlers::processSchemaComponents(XSNamespaceItem* namespaceItem) {
	sendIndentedElement(PSVIUni::fgSchemaComponents);
	XSNamedMap<XSTypeDefinition>* types = (XSNamedMap<XSTypeDefinition>*)(namespaceItem->getComponents(XSConstants::TYPE_DEFINITION));
	for (XMLSize_t typeCount = 0; typeCount < types->getLength(); typeCount++) {
		processTypeDefinition(types->item(typeCount));
	}
	XSNamedMap<XSAttributeDeclaration>* attributes = (XSNamedMap<XSAttributeDeclaration>*)namespaceItem->getComponents(XSConstants::ATTRIBUTE_DECLARATION);
	for (XMLSize_t attrCount = 0; attrCount < attributes->getLength(); attrCount++) {
		processAttributeDeclaration(attributes->item(attrCount));
	}
	XSNamedMap<XSElementDeclaration>* elements = (XSNamedMap<XSElementDeclaration>*)namespaceItem->getComponents(XSConstants::ELEMENT_DECLARATION);
	for (XMLSize_t elemCount = 0; elemCount < elements->getLength(); elemCount++) {
		processElementDeclaration(elements->item(elemCount));
	}
	XSNamedMap<XSAttributeGroupDefinition>* attrGroups = (XSNamedMap<XSAttributeGroupDefinition>*)namespaceItem->getComponents(XSConstants::ATTRIBUTE_GROUP_DEFINITION);
	for (XMLSize_t attrGroupCount = 0; attrGroupCount < attrGroups->getLength(); attrGroupCount++) {
		processAttributeGroupDefinition(attrGroups->item(attrGroupCount));
	}
	XSNamedMap<XSModelGroupDefinition>* modelGroups = (XSNamedMap<XSModelGroupDefinition>*)namespaceItem->getComponents(XSConstants::MODEL_GROUP_DEFINITION);
	for (XMLSize_t modelGroupCount = 0; modelGroupCount < modelGroups->getLength(); modelGroupCount++) {
		processModelGroupDefinition(modelGroups->item(modelGroupCount));
	}
	XSNamedMap<XSNotationDeclaration>* notations = (XSNamedMap<XSNotationDeclaration>*)namespaceItem->getComponents(XSConstants::NOTATION_DECLARATION);
	for (XMLSize_t notationCount = 0; notationCount < notations->getLength(); notationCount++) {
		processNotationDeclaration(notations->item(notationCount));
	}
	sendUnindentedElement(PSVIUni::fgSchemaComponents);
}